

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GoogleCloudKms.cpp
# Opt level: O3

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
Vault::GoogleCloudKms::trimKeyVersions
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,GoogleCloudKms *this,Path *path)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  Client *client;
  string local_c0;
  Path local_a0;
  Url local_80;
  _Hashtable<_ea4cb122_> local_60;
  
  client = *(Client **)this;
  Vault::operator+(&local_c0,"keys/trim/",path);
  paVar1 = &local_a0.value_.field_2;
  paVar2 = &local_c0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p == paVar2) {
    local_a0.value_.field_2._8_8_ = local_c0.field_2._8_8_;
    local_a0.value_._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_a0.value_._M_dataplus._M_p = local_c0._M_dataplus._M_p;
  }
  local_a0.value_.field_2._M_allocated_capacity._1_7_ = local_c0.field_2._M_allocated_capacity._1_7_
  ;
  local_a0.value_.field_2._M_local_buf[0] = local_c0.field_2._M_local_buf[0];
  local_a0.value_._M_string_length = local_c0._M_string_length;
  local_c0._M_string_length = 0;
  local_c0.field_2._M_local_buf[0] = '\0';
  local_c0._M_dataplus._M_p = (pointer)paVar2;
  getUrl(&local_80,this,&local_a0);
  local_60._M_buckets = &local_60._M_single_bucket;
  local_60._M_bucket_count = 1;
  local_60._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_60._M_element_count = 0;
  local_60._M_rehash_policy._M_max_load_factor = 1.0;
  local_60._M_rehash_policy._4_4_ = 0;
  local_60._M_rehash_policy._M_next_resize = 0;
  local_60._M_single_bucket = (__node_base_ptr)0x0;
  HttpConsumer::post(__return_storage_ptr__,client,&local_80,(Parameters *)&local_60);
  std::_Hashtable<$ea4cb122$>::~_Hashtable(&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.value_._M_dataplus._M_p != &local_80.value_.field_2) {
    operator_delete(local_80.value_._M_dataplus._M_p,
                    local_80.value_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0.value_._M_dataplus._M_p != paVar1) {
    operator_delete(local_a0.value_._M_dataplus._M_p,
                    local_a0.value_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar2) {
    operator_delete(local_c0._M_dataplus._M_p,
                    CONCAT71(local_c0.field_2._M_allocated_capacity._1_7_,
                             local_c0.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::optional<std::string>
Vault::GoogleCloudKms::trimKeyVersions(const Path &path) {
  return HttpConsumer::post(client_, getUrl(Path{"keys/trim/" + path}),
                            Parameters{});
}